

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O1

TermSpec __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::deref
          (InstMatcher *this,TermList var)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  Entry *pEVar4;
  undefined8 extraout_RDX;
  ulong unaff_RBP;
  TermList unaff_R15;
  TermSpec TVar5;
  TermList local_28;
  
  local_28._content = var._content;
  do {
    pEVar4 = ::Lib::
             DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&this->_bindings,&local_28);
    if (pEVar4 == (Entry *)0x0) {
      unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),((uint)local_28._content & 3) == 1);
      bVar3 = false;
      unaff_R15._content = local_28._content;
    }
    else {
      bVar1 = (pEVar4->_val).q;
      uVar2 = (pEVar4->_val).t._content;
      if (((((uint)uVar2 & 3) != 1 | bVar1) & (uVar2 & 3) != 0) == 1) {
        bVar3 = true;
        local_28._content = uVar2;
      }
      else {
        bVar3 = false;
        unaff_RBP = CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar1) & 0xffffffff;
        unaff_R15._content = uVar2;
      }
    }
  } while (bVar3);
  TVar5._0_8_ = unaff_RBP & 0xffffffff;
  TVar5.t._content = unaff_R15._content;
  return TVar5;
}

Assistant:

typename SubstitutionTree<LeafData_>::InstMatcher::TermSpec SubstitutionTree<LeafData_>::InstMatcher::deref(TermList var)
{
  ASS_REP(var.isVar(), var.tag());

#if VDEBUG
  int ctr=0;
#endif
  for(;;) {
    TermSpec res;
    if(!_bindings.find(var, res)) {
	return TermSpec(var.isOrdinaryVar() ? true : false, var);
    }
    if( res.t.isTerm() || (!res.q && res.t.isOrdinaryVar()) ) {
	return res;
    }
    ASS(!res.q || !res.t.isSpecialVar());
    var=res.t;
#if VDEBUG
    ctr++;
    ASS_L(ctr,1000000); //assert that there are no cycles
#endif
  }
}